

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcWallStandardCase::IfcWallStandardCase(IfcWallStandardCase *this)

{
  *(undefined ***)&(this->super_IfcWall).field_0x168 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0x170 = 0;
  *(char **)&this->field_0x178 = "IfcWallStandardCase";
  IfcWall::IfcWall(&this->super_IfcWall,&PTR_construction_vtable_24__007ec580);
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject
       = 0x7ec428;
  *(undefined8 *)&(this->super_IfcWall).field_0x168 = 0x7ec568;
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject
    .field_0x88 = 0x7ec450;
  (this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x7ec478;
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject
    .field_0xd0 = 0x7ec4a0;
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.field_0x100 =
       0x7ec4c8;
  *(undefined8 *)&(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.field_0x138 =
       0x7ec4f0;
  *(undefined8 *)&(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.field_0x148 =
       0x7ec518;
  *(undefined8 *)&(this->super_IfcWall).super_IfcBuildingElement.field_0x158 = 0x7ec540;
  return;
}

Assistant:

IfcWallStandardCase() : Object("IfcWallStandardCase") {}